

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

Decision __thiscall
tonk::ReceiverBandwidthControl::UpdateCC
          (ReceiverBandwidthControl *this,uint64_t nowUsec,uint smoothedSendDelayUsec)

{
  long lVar1;
  undefined4 uVar2;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 auVar3 [16];
  uint owdUsec;
  uint bpsDelta;
  uint64_t rate;
  uint bps;
  uint tickIntervalUsec;
  uint queue_delay_usec;
  Counter32 queue_delayTS24;
  float plr;
  uint maxBW;
  uint min_rtt_usec;
  uint owd_recv_usec;
  uint owd_send_usec;
  bool updated;
  LogStringBuffer buffer;
  WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
  *in_stack_fffffffffffffcf8;
  LogStringBuffer *in_stack_fffffffffffffd00;
  uint local_2cc;
  LogStringBuffer *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  uint local_2b8;
  int local_2b0;
  int local_2ac;
  Counter<unsigned_int,_32U> local_2a8;
  float local_2a4;
  uint local_2a0;
  int local_29c;
  int local_298;
  bool local_28d;
  undefined8 local_288;
  int *local_278;
  int *local_270;
  Counter<unsigned_int,_32U> *local_268;
  Counter<unsigned_int,_32U> *local_260;
  char *local_258;
  long local_250;
  char *local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  long local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  long local_58;
  string *local_50;
  undefined1 *local_48;
  long local_40;
  char *local_38;
  undefined1 *local_30;
  long local_28;
  string *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_28d = false;
  local_298 = *(int *)(in_RDI + 0x24);
  local_29c = in_EDX + local_298;
  if (local_29c == 0) {
    local_29c = 100000;
  }
  *(int *)(in_RDI + 0x128) = local_29c << 3;
  if (*(uint *)(in_RDI + 0x128) < 4000000) {
    *(undefined4 *)(in_RDI + 0x128) = 4000000;
  }
  local_288 = in_RSI;
  local_2a0 = siamese::WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_>::
              GetBest((WindowedMinMax<unsigned_int,_siamese::WindowedMaxCompare<unsigned_int>_> *)
                      (in_RDI + 0x130));
  local_2a4 = *(float *)(in_RDI + 0x28);
  auVar3 = ZEXT416((uint)local_2a4);
  if (local_2a4 <= 0.1) {
    auVar3 = ZEXT416((uint)local_2a4);
    siamese::
    WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
    ::GetBest(in_stack_fffffffffffffcf8);
    siamese::
    WindowedMinMax<Counter<unsigned_int,_32U>,_siamese::WindowedMinCompare<Counter<unsigned_int,_32U>_>_>
    ::GetBest(in_stack_fffffffffffffcf8);
    local_268 = &local_2a8;
    local_270 = &local_2ac;
    local_278 = &local_2b0;
    Counter<unsigned_int,_32U>::Counter(&local_2a8,local_2ac - local_2b0);
    local_260 = &local_2a8;
    if (local_2a8.Value << 3 < 0x2711) {
      local_28d = *(int *)(in_RDI + 0x16c) < 1;
      *(undefined4 *)(in_RDI + 0x16c) = 1;
    }
    else {
      local_28d = -1 < *(int *)(in_RDI + 0x16c);
      *(undefined4 *)(in_RDI + 0x16c) = 0xffffffff;
    }
  }
  else {
    local_28d = -1 < *(int *)(in_RDI + 0x16c);
    *(undefined4 *)(in_RDI + 0x16c) = 0xffffffff;
  }
  local_2b8 = (int)local_288 - (int)*(undefined8 *)(in_RDI + 0x170);
  if (40000 < local_2b8) {
    local_2b8 = 40000;
  }
  *(undefined8 *)(in_RDI + 0x170) = local_288;
  if ((*(byte *)(in_RDI + 0x168) & 1) == 0) {
    local_2cc = (uint)(((ulong)*(uint *)(in_RDI + 0x18) * (ulong)(local_2b8 * 0x514)) / 10000000000)
    ;
    if (100000 < *(uint *)(in_RDI + 0x24)) {
      if (local_28d != false) {
        if (*(int *)(in_RDI + 0x16c) < 0) {
          auVar3 = vcvtusi2ss_avx512f(auVar3,*(undefined4 *)(in_RDI + 0xa0));
          uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar3._0_4_ * 0.9)));
          *(undefined4 *)(in_RDI + 0xa0) = uVar2;
        }
        else {
          auVar3 = vcvtusi2ss_avx512f(auVar3,*(undefined4 *)(in_RDI + 0xa0));
          uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar3._0_4_ * 1.1)));
          *(undefined4 *)(in_RDI + 0xa0) = uVar2;
        }
      }
      local_2cc = (local_2cc * 100000) / *(uint *)(in_RDI + 0x24);
    }
    if (*(int *)(in_RDI + 0x16c) < 0) {
      if (local_2cc * 2 < *(uint *)(in_RDI + 0xa0)) {
        *(uint *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + local_2cc * -2;
      }
    }
    else if ((uint)(*(int *)(in_RDI + 0xa0) * 3) >> 2 <= local_2a0) {
      *(uint *)(in_RDI + 0xa0) = local_2cc + *(int *)(in_RDI + 0xa0);
    }
  }
  else if (*(int *)(in_RDI + 0x16c) < 0) {
    *(undefined1 *)(in_RDI + 0x168) = 0;
    lVar1 = *(long *)(in_RDI + 8);
    local_258 = "Leaving slow-start";
    local_23c = 1;
    local_248 = "Leaving slow-start";
    local_22c = 1;
    if (*(int *)(lVar1 + 8) < 2) {
      local_7c = 1;
      local_88 = "Leaving slow-start";
      local_250 = lVar1;
      local_238 = lVar1;
      local_228 = lVar1;
      local_78 = lVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8,Trace);
      local_68 = (string *)(lVar1 + 0x38);
      local_70 = local_88;
      local_60 = local_210;
      local_58 = lVar1;
      local_50 = local_68;
      local_48 = local_210;
      local_40 = lVar1;
      local_20 = local_68;
      local_18 = local_210;
      std::operator<<(aoStack_200,local_68);
      local_30 = local_60;
      local_38 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      local_28 = lVar1;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x19b5bf);
    }
    auVar3 = vcvtusi2ss_avx512f(auVar3,local_2a0);
    uVar2 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar3._0_4_ * 0.9)));
    *(undefined4 *)(in_RDI + 0xa0) = uVar2;
  }
  else if ((uint)(*(int *)(in_RDI + 0xa0) * 3) >> 2 <= local_2a0) {
    *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) << 1;
  }
  return (uint)((local_28d & 1U) == 0);
}

Assistant:

ReceiverBandwidthControl::Decision ReceiverBandwidthControl::UpdateCC(
    uint64_t nowUsec,
    unsigned smoothedSendDelayUsec)
{
    bool updated = false;


    // Estimate minimum RTT so we know how long we have to flush the queue we build up
    const unsigned owd_send_usec = smoothedSendDelayUsec;
    const unsigned owd_recv_usec = Bandwidth.Measurement.SmoothedMinTripUsec;
    unsigned min_rtt_usec = owd_send_usec + owd_recv_usec;
    if (min_rtt_usec <= 0) {
        min_rtt_usec = 100000; // Default until we have a full round trip
    }

    // Wait at least 8 round trips to find the minimum OWD
    MinOWD_WindowUsec = min_rtt_usec * 8;

    // Wait at least 4 seconds
    if (MinOWD_WindowUsec < 4000000) {
        MinOWD_WindowUsec = 4000000;
    }


    // Maximum recently seen bandwidth
    const unsigned maxBW = RecentMaxBW.GetBest();


    // In reaction to high PLR we should decrease rate.
    // In reaction to moderate PLR we should not increase rate.
    const float plr = Bandwidth.Measurement.SmoothedPLR;

    if (plr > TONKCC_CONGESTION_PLR)
    {
        // Reduce BW
        updated = (Momentum >= 0);
        Momentum = -1;
    }
    else
    {
        // Update queuing delay for each packet that arrives
        const Counter32 queue_delayTS24 = RecentOWD.GetBest() - MinOWD.GetBest();
        const unsigned queue_delay_usec = queue_delayTS24.ToUnsigned() << kTime23LostBits;

        // If queue delay is detected:
        if (queue_delay_usec > protocol::kDetectQueueDelayUsec)
        {
            // Reduce BW
            updated = (Momentum >= 0);
            Momentum = -1;
        }
        else
        {
            // Increase BW
            updated = (Momentum <= 0);
            Momentum = 1;
        }
    }


    // Time since last tick
    unsigned tickIntervalUsec = static_cast<unsigned>(nowUsec - LastTickUsec);
    if (tickIntervalUsec > protocol::kSendTimerTickIntervalUsec * 8) {
        tickIntervalUsec = protocol::kSendTimerTickIntervalUsec * 8;
    }
    LastTickUsec = nowUsec;

    if (InSlowStart)
    {
        if (Momentum < 0)
        {
            InSlowStart = false;
            Deps.Logger->Debug("Leaving slow-start");

            NextShape.AppBPS = (unsigned)(maxBW * 0.9f);
        }
        else
        {
            // If we have hit the previous target:
            if (maxBW >= (NextShape.AppBPS * 3 / 4)) {
                NextShape.AppBPS *= 2;
            }
        }
    }
    else
    {
        const unsigned bps = Bandwidth.Measurement.SmoothedGoodputBPS;

        // Rate expression selected by manually checking a fixed-rate simulation
        // from 125 KB/s, 250 KB/s, ..., 2 MB/s, 4 MB/s
        uint64_t rate = tickIntervalUsec * 1300;
        rate *= bps;
        rate /= protocol::kSendTimerTickIntervalUsec * 2000000ULL;
        unsigned bpsDelta = static_cast<unsigned>(rate);

        const unsigned owdUsec = Bandwidth.Measurement.SmoothedMinTripUsec;

        // If there is moderate or high latency, then percentage jumps help a lot
        if (owdUsec > 100000)
        {
            // Skip ahead in the right direction
            if (updated) {
                if (Momentum < 0) {
                    NextShape.AppBPS = (unsigned)(NextShape.AppBPS * 0.9f);
                }
                else {
                    NextShape.AppBPS = (unsigned)(NextShape.AppBPS * 1.1f);
                }
            }

            bpsDelta *= 100000;
            bpsDelta /= owdUsec;
        }

        // If in congestion:
        if (Momentum < 0)
        {
            if (NextShape.AppBPS > bpsDelta * 2) {
                NextShape.AppBPS -= bpsDelta * 2;
            }
        }
        // If caution is not raised:
        else if (maxBW >= (NextShape.AppBPS * 3 / 4))
        {
            NextShape.AppBPS += bpsDelta;
        }
    }

    return updated ? Decision::PushUpdateInAck : Decision::NoChange;
}